

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O2

void secp256k1_modinv64_mul_62
               (secp256k1_modinv64_signed62 *r,secp256k1_modinv64_signed62 *a,int alen,
               int64_t factor)

{
  ulong uVar1;
  ulong uVar2;
  int64_t iVar3;
  long lVar4;
  secp256k1_int128 c;
  int local_44;
  secp256k1_modinv64_signed62 *local_40;
  int64_t local_38;
  
  c._0_8_ = 0;
  c._8_8_ = 0;
  local_44 = alen;
  local_40 = a;
  local_38 = factor;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    if (lVar4 < alen) {
      secp256k1_i128_accum_mul(&c,local_40->v[lVar4],local_38);
    }
    uVar1 = c._8_8_ << 2;
    r->v[lVar4] = (ulong)c & 0x3fffffffffffffff;
    c._8_8_ = c._8_8_ >> 0x3e;
    c._0_8_ = uVar1 | (ulong)c >> 0x3e;
  }
  if (4 < local_44) {
    secp256k1_i128_accum_mul(&c,local_40->v[4],local_38);
  }
  lVar4 = c._8_8_;
  uVar1 = (ulong)c;
  uVar2 = secp256k1_i128_to_i64(&c);
  if ((long)uVar2 >> 0x3f == lVar4 && uVar1 == uVar2) {
    iVar3 = secp256k1_i128_to_i64(&c);
    r->v[4] = iVar3;
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modinv64_impl.h"
          ,0x34,"test condition failed: secp256k1_i128_eq_var(&c, &d)");
  abort();
}

Assistant:

static void secp256k1_modinv64_mul_62(secp256k1_modinv64_signed62 *r, const secp256k1_modinv64_signed62 *a, int alen, int64_t factor) {
    const uint64_t M62 = UINT64_MAX >> 2;
    secp256k1_int128 c, d;
    int i;
    secp256k1_i128_from_i64(&c, 0);
    for (i = 0; i < 4; ++i) {
        if (i < alen) secp256k1_i128_accum_mul(&c, a->v[i], factor);
        r->v[i] = secp256k1_i128_to_u64(&c) & M62; secp256k1_i128_rshift(&c, 62);
    }
    if (4 < alen) secp256k1_i128_accum_mul(&c, a->v[4], factor);
    secp256k1_i128_from_i64(&d, secp256k1_i128_to_i64(&c));
    VERIFY_CHECK(secp256k1_i128_eq_var(&c, &d));
    r->v[4] = secp256k1_i128_to_i64(&c);
}